

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attached_database.cpp
# Opt level: O3

void __thiscall
duckdb::AttachedDatabase::AttachedDatabase
          (AttachedDatabase *this,DatabaseInstance *db,Catalog *catalog_p,
          StorageExtension *storage_extension_p,ClientContext *context,string *name_p,
          AttachInfo *info,AttachOptions *options)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  unique_ptr<duckdb::Catalog,_std::default_delete<duckdb::Catalog>,_true> *this_00;
  optional_ptr<duckdb::StorageExtension,_true> *this_01;
  AccessMode AVar2;
  undefined8 uVar3;
  code *pcVar4;
  _Head_base<0UL,_duckdb::Catalog_*,_false> _Var5;
  pointer pcVar6;
  _Head_base<0UL,_duckdb::StorageManager_*,_false> _Var7;
  _Head_base<0UL,_duckdb::TransactionManager_*,_false> _Var8;
  _Alloc_hider _Var9;
  int iVar10;
  type pAVar11;
  pointer pCVar12;
  _Head_base<0UL,_duckdb::StorageManager_*,_false> this_02;
  type pCVar13;
  _Head_base<0UL,_duckdb::TransactionManager_*,_false> _Var14;
  InternalException *pIVar15;
  pointer *__ptr;
  string local_88;
  undefined1 local_68 [16];
  _Alloc_hider local_58;
  undefined1 local_50 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  local_50._0_8_ = (name_p->_M_dataplus)._M_p;
  paVar1 = &name_p->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._0_8_ == paVar1) {
    local_40._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_40._8_8_ = *(undefined8 *)((long)&name_p->field_2 + 8);
    local_50._0_8_ = &local_40;
  }
  else {
    local_40._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_50._8_8_ = name_p->_M_string_length;
  (name_p->_M_dataplus)._M_p = (pointer)paVar1;
  name_p->_M_string_length = 0;
  (name_p->field_2)._M_local_buf[0] = '\0';
  CatalogEntry::CatalogEntry(&this->super_CatalogEntry,DATABASE_ENTRY,catalog_p,(string *)local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._0_8_ != &local_40) {
    operator_delete((void *)local_50._0_8_);
  }
  (this->super_CatalogEntry)._vptr_CatalogEntry = (_func_int **)&PTR__AttachedDatabase_01971388;
  this->db = db;
  local_68._8_8_ = &this->storage;
  this_00 = &this->catalog;
  (this->storage).
  super_unique_ptr<duckdb::StorageManager,_std::default_delete<duckdb::StorageManager>_>._M_t.
  super___uniq_ptr_impl<duckdb::StorageManager,_std::default_delete<duckdb::StorageManager>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::StorageManager_*,_std::default_delete<duckdb::StorageManager>_>.
  super__Head_base<0UL,_duckdb::StorageManager_*,_false>._M_head_impl = (StorageManager *)0x0;
  (this->catalog).super_unique_ptr<duckdb::Catalog,_std::default_delete<duckdb::Catalog>_>._M_t.
  super___uniq_ptr_impl<duckdb::Catalog,_std::default_delete<duckdb::Catalog>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Catalog_*,_std::default_delete<duckdb::Catalog>_>.
  super__Head_base<0UL,_duckdb::Catalog_*,_false>._M_head_impl = (Catalog *)0x0;
  (this->transaction_manager).
  super_unique_ptr<duckdb::TransactionManager,_std::default_delete<duckdb::TransactionManager>_>.
  _M_t.
  super___uniq_ptr_impl<duckdb::TransactionManager,_std::default_delete<duckdb::TransactionManager>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::TransactionManager_*,_std::default_delete<duckdb::TransactionManager>_>
  .super__Head_base<0UL,_duckdb::TransactionManager_*,_false>._M_head_impl =
       (TransactionManager *)0x0;
  (this->parent_catalog).ptr = catalog_p;
  this_01 = &this->storage_extension;
  (this->storage_extension).ptr = storage_extension_p;
  this->is_initial_database = false;
  this->is_closed = false;
  this->type = (uint)(options->access_mode == READ_ONLY);
  local_58._M_p = (pointer)this_00;
  optional_ptr<duckdb::StorageExtension,_true>::CheckValid(this_01);
  uVar3 = *(undefined8 *)(this_01->ptr + 0x18);
  optional_ptr<duckdb::StorageExtension,_true>::CheckValid(this_01);
  pcVar4 = *(code **)((this->storage_extension).ptr + 8);
  AttachInfo::Copy((AttachInfo *)local_68);
  pAVar11 = unique_ptr<duckdb::AttachInfo,_std::default_delete<duckdb::AttachInfo>,_true>::operator*
                      ((unique_ptr<duckdb::AttachInfo,_std::default_delete<duckdb::AttachInfo>,_true>
                        *)local_68);
  (*pcVar4)(&local_88,uVar3,context,this,&(this->super_CatalogEntry).name,pAVar11,
            options->access_mode);
  _Var9._M_p = local_88._M_dataplus._M_p;
  local_88._M_dataplus._M_p = (pointer)0x0;
  _Var5._M_head_impl =
       (this_00->super_unique_ptr<duckdb::Catalog,_std::default_delete<duckdb::Catalog>_>)._M_t.
       super___uniq_ptr_impl<duckdb::Catalog,_std::default_delete<duckdb::Catalog>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::Catalog_*,_std::default_delete<duckdb::Catalog>_>.
       super__Head_base<0UL,_duckdb::Catalog_*,_false>._M_head_impl;
  (this_00->super_unique_ptr<duckdb::Catalog,_std::default_delete<duckdb::Catalog>_>)._M_t.
  super___uniq_ptr_impl<duckdb::Catalog,_std::default_delete<duckdb::Catalog>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Catalog_*,_std::default_delete<duckdb::Catalog>_>.
  super__Head_base<0UL,_duckdb::Catalog_*,_false>._M_head_impl = (Catalog *)_Var9._M_p;
  if (_Var5._M_head_impl != (Catalog *)0x0) {
    (**(code **)((long)(_Var5._M_head_impl)->_vptr_Catalog + 8))();
    if ((long *)local_88._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_88._M_dataplus._M_p + 8))();
    }
  }
  local_88._M_dataplus._M_p = (pointer)0x0;
  if ((__uniq_ptr_impl<duckdb::AttachInfo,_std::default_delete<duckdb::AttachInfo>_>)local_68._0_8_
      != (__uniq_ptr_impl<duckdb::AttachInfo,_std::default_delete<duckdb::AttachInfo>_>)0x0) {
    (*((ParseInfo *)local_68._0_8_)->_vptr_ParseInfo[1])();
  }
  if ((this_00->super_unique_ptr<duckdb::Catalog,_std::default_delete<duckdb::Catalog>_>)._M_t.
      super___uniq_ptr_impl<duckdb::Catalog,_std::default_delete<duckdb::Catalog>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::Catalog_*,_std::default_delete<duckdb::Catalog>_>.
      super__Head_base<0UL,_duckdb::Catalog_*,_false>._M_head_impl == (Catalog *)0x0) {
    pIVar15 = (InternalException *)__cxa_allocate_exception(0x10);
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_88,"AttachedDatabase - attach function did not return a catalog","")
    ;
    InternalException::InternalException(pIVar15,&local_88);
    __cxa_throw(pIVar15,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  pCVar12 = unique_ptr<duckdb::Catalog,_std::default_delete<duckdb::Catalog>,_true>::operator->
                      (this_00);
  iVar10 = (*pCVar12->_vptr_Catalog[2])(pCVar12);
  if ((char)iVar10 != '\0') {
    AVar2 = options->access_mode;
    this_02._M_head_impl = (StorageManager *)operator_new(0x58);
    pcVar6 = (info->path)._M_dataplus._M_p;
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_88,pcVar6,pcVar6 + (info->path)._M_string_length);
    SingleFileStorageManager::SingleFileStorageManager
              ((SingleFileStorageManager *)this_02._M_head_impl,this,&local_88,AVar2 == READ_ONLY);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p);
    }
    _Var7._M_head_impl =
         (((unique_ptr<duckdb::StorageManager,_std::default_delete<duckdb::StorageManager>_> *)
          local_68._8_8_)->_M_t).
         super___uniq_ptr_impl<duckdb::StorageManager,_std::default_delete<duckdb::StorageManager>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::StorageManager_*,_std::default_delete<duckdb::StorageManager>_>
         .super__Head_base<0UL,_duckdb::StorageManager_*,_false>._M_head_impl;
    (((unique_ptr<duckdb::StorageManager,_std::default_delete<duckdb::StorageManager>_> *)
     local_68._8_8_)->_M_t).
    super___uniq_ptr_impl<duckdb::StorageManager,_std::default_delete<duckdb::StorageManager>_>._M_t
    .super__Tuple_impl<0UL,_duckdb::StorageManager_*,_std::default_delete<duckdb::StorageManager>_>.
    super__Head_base<0UL,_duckdb::StorageManager_*,_false>._M_head_impl = this_02._M_head_impl;
    if (_Var7._M_head_impl != (StorageManager *)0x0) {
      (**(code **)((long)(_Var7._M_head_impl)->_vptr_StorageManager + 8))();
    }
  }
  optional_ptr<duckdb::StorageExtension,_true>::CheckValid(this_01);
  pcVar4 = *(code **)(this_01->ptr + 0x10);
  pCVar13 = unique_ptr<duckdb::Catalog,_std::default_delete<duckdb::Catalog>,_true>::operator*
                      ((unique_ptr<duckdb::Catalog,_std::default_delete<duckdb::Catalog>,_true> *)
                       local_58._M_p);
  (*pcVar4)(&local_88,uVar3,this,pCVar13);
  _Var14._M_head_impl = (TransactionManager *)local_88._M_dataplus._M_p;
  local_88._M_dataplus._M_p = (pointer)0x0;
  _Var8._M_head_impl =
       (this->transaction_manager).
       super_unique_ptr<duckdb::TransactionManager,_std::default_delete<duckdb::TransactionManager>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::TransactionManager,_std::default_delete<duckdb::TransactionManager>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::TransactionManager_*,_std::default_delete<duckdb::TransactionManager>_>
       .super__Head_base<0UL,_duckdb::TransactionManager_*,_false>._M_head_impl;
  (this->transaction_manager).
  super_unique_ptr<duckdb::TransactionManager,_std::default_delete<duckdb::TransactionManager>_>.
  _M_t.
  super___uniq_ptr_impl<duckdb::TransactionManager,_std::default_delete<duckdb::TransactionManager>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::TransactionManager_*,_std::default_delete<duckdb::TransactionManager>_>
  .super__Head_base<0UL,_duckdb::TransactionManager_*,_false>._M_head_impl = _Var14._M_head_impl;
  if (_Var8._M_head_impl != (TransactionManager *)0x0) {
    (**(code **)((long)(_Var8._M_head_impl)->_vptr_TransactionManager + 8))();
    if ((long *)local_88._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_88._M_dataplus._M_p + 8))();
    }
    _Var14._M_head_impl =
         (this->transaction_manager).
         super_unique_ptr<duckdb::TransactionManager,_std::default_delete<duckdb::TransactionManager>_>
         ._M_t.
         super___uniq_ptr_impl<duckdb::TransactionManager,_std::default_delete<duckdb::TransactionManager>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::TransactionManager_*,_std::default_delete<duckdb::TransactionManager>_>
         .super__Head_base<0UL,_duckdb::TransactionManager_*,_false>._M_head_impl;
  }
  if (_Var14._M_head_impl != (TransactionManager *)0x0) {
    (this->super_CatalogEntry).internal = true;
    return;
  }
  pIVar15 = (InternalException *)__cxa_allocate_exception(0x10);
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_88,
             "AttachedDatabase - create_transaction_manager function did not return a transaction manager"
             ,"");
  InternalException::InternalException(pIVar15,&local_88);
  __cxa_throw(pIVar15,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

AttachedDatabase::AttachedDatabase(DatabaseInstance &db, Catalog &catalog_p, StorageExtension &storage_extension_p,
                                   ClientContext &context, string name_p, const AttachInfo &info,
                                   const AttachOptions &options)
    : CatalogEntry(CatalogType::DATABASE_ENTRY, catalog_p, std::move(name_p)), db(db), parent_catalog(&catalog_p),
      storage_extension(&storage_extension_p) {

	if (options.access_mode == AccessMode::READ_ONLY) {
		type = AttachedDatabaseType::READ_ONLY_DATABASE;
	} else {
		type = AttachedDatabaseType::READ_WRITE_DATABASE;
	}

	StorageExtensionInfo *storage_info = storage_extension->storage_info.get();
	catalog = storage_extension->attach(storage_info, context, *this, name, *info.Copy(), options.access_mode);
	if (!catalog) {
		throw InternalException("AttachedDatabase - attach function did not return a catalog");
	}
	if (catalog->IsDuckCatalog()) {
		// The attached database uses the DuckCatalog.
		auto read_only = options.access_mode == AccessMode::READ_ONLY;
		storage = make_uniq<SingleFileStorageManager>(*this, info.path, read_only);
	}
	transaction_manager = storage_extension->create_transaction_manager(storage_info, *this, *catalog);
	if (!transaction_manager) {
		throw InternalException(
		    "AttachedDatabase - create_transaction_manager function did not return a transaction manager");
	}
	internal = true;
}